

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * iuutil::CmpHelperSTRLNEQ(char *expr1,char *expr2,size_t len1,char *val2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionResult *pAVar2;
  size_t in_RCX;
  AssertionResult *in_RDI;
  char *in_R8;
  size_t len2;
  size_t local_68;
  char *local_60;
  unsigned_long local_58;
  char *local_50;
  char *local_48;
  AssertionResult local_40;
  
  local_68 = strlen(in_R8);
  if (local_68 == in_RCX) {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
  }
  else {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar2 = iutest::AssertionResult::operator<<(&local_40,(char (*) [18])"error: Value of: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])" == strlen(");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [2])0x16c4f0);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_60);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [4])0x16ce29);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_68);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_58);
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    std::__cxx11::string::_M_construct<char*>();
    in_RDI->m_result = pAVar2->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  return in_RDI;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const char* val2)
{
    const size_t len2 = strlen(val2);
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}